

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveTable(Parser *parser,int flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Encoding encoding;
  Token *token;
  TableCommand *this;
  undefined4 in_register_00000034;
  Parser *this_00;
  StringLiteral encodingName;
  vector<Expression,_std::allocator<Expression>_> list;
  StringLiteral fileName;
  string local_88;
  vector<Expression,_std::allocator<Expression>_> local_68;
  StringLiteral local_50;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,flags);
  token = Tokenizer::peekToken
                    ((this_00->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  local_68.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_68.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Parser::parseExpressionList(this_00,&local_68,1,2);
  if (!bVar2) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0017e034;
  }
  paVar1 = &local_50._value.field_2;
  local_50._value._M_string_length = 0;
  local_50._value.field_2._M_local_buf[0] = '\0';
  local_50._value._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = Expression::evaluateString
                    (local_68.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_50,true);
  if (bVar2) {
    encoding = GUESS;
    if ((long)local_68.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_68.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      bVar2 = Expression::evaluateString
                        (local_68.super__Vector_base<Expression,_std::allocator<Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1,(StringLiteral *)&local_88,
                         true);
      if (bVar2) {
        encoding = getEncodingFromString(&local_88);
      }
      else {
        Parser::printError<>(this_00,token,"Invalid encoding name");
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        encoding = GUESS;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar2) goto LAB_0017e01d;
    }
    StringLiteral::path((path *)&local_88,&local_50);
    this = (TableCommand *)operator_new(0xa8);
    TableCommand::TableCommand(this,(path *)&local_88,encoding);
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this;
    ghc::filesystem::path::~path((path *)&local_88);
  }
  else {
    Parser::printError<>(this_00,token,"Invalid file name");
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_0017e01d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._value._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._value._M_dataplus._M_p,
                    CONCAT71(local_50._value.field_2._M_allocated_capacity._1_7_,
                             local_50._value.field_2._M_local_buf[0]) + 1);
  }
LAB_0017e034:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_68);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveTable(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral fileName;
	if (!list[0].evaluateString(fileName,true))
	{
		parser.printError(start, "Invalid file name");
		return nullptr;
	}

	TextFile::Encoding encoding = TextFile::GUESS;
	if (list.size() == 2)
	{
		StringLiteral encodingName;
		if (!list[1].evaluateString(encodingName,true))
		{
			parser.printError(start, "Invalid encoding name");
			return nullptr;
		}

		encoding = getEncodingFromString(encodingName.string());
	}

	return std::make_unique<TableCommand>(fileName.path(),encoding);
}